

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

bool __thiscall zmq::zmtp_engine_t::handshake_v3_x(zmtp_engine_t *this,bool downgrade_sub_)

{
  int iVar1;
  void *pvVar2;
  session_base_t *psVar3;
  plain_client_t *this_00;
  int extraout_var;
  int in_ECX;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int in_ESI;
  stream_engine_base_t *in_RDI;
  options_t *in_stack_ffffffffffffff30;
  options_t *in_stack_ffffffffffffff38;
  socket_base_t *in_stack_ffffffffffffff40;
  session_base_t *in_stack_ffffffffffffff48;
  plain_client_t *ppVar4;
  string *in_stack_ffffffffffffff50;
  session_base_t *in_stack_ffffffffffffff58;
  mechanism_t *pmVar5;
  void *local_90;
  mechanism_t *local_80;
  undefined8 in_stack_ffffffffffffff88;
  error_reason_t reason_;
  stream_engine_base_t *in_stack_ffffffffffffff90;
  void *local_68;
  bool local_1;
  
  reason_ = (error_reason_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if ((in_RDI->_options).mechanism == 0) {
    in_ESI = 0x32ec06;
    iVar1 = memcmp(in_RDI[1]._options.routing_id + 0x6b,"NULL",0x14);
    in_EDX = extraout_EDX;
    if (iVar1 != 0) goto LAB_00312502;
    pvVar2 = operator_new(0x5e8,(nothrow_t *)&std::nothrow);
    local_68 = (void *)0x0;
    if (pvVar2 != (void *)0x0) {
      stream_engine_base_t::session(in_RDI);
      null_mechanism_t::null_mechanism_t
                ((null_mechanism_t *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (string *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_68 = pvVar2;
    }
    local_80 = (mechanism_t *)0x0;
    if (local_68 != (void *)0x0) {
      local_80 = (mechanism_t *)((long)local_68 + 0x50);
    }
    in_RDI->_mechanism = local_80;
    if (in_RDI->_mechanism == (mechanism_t *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x161);
      fflush(_stderr);
      zmq_abort((char *)0x3124c0);
    }
LAB_003127b6:
    in_RDI->_next_msg =
         (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::next_handshake_command;
    *(undefined8 *)&in_RDI->field_0x550 = 0;
    in_RDI->_process_msg =
         (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::process_handshake_command;
    *(undefined8 *)&in_RDI->field_0x560 = 0;
    local_1 = true;
  }
  else {
LAB_00312502:
    if ((in_RDI->_options).mechanism == 1) {
      in_ESI = 0x32ec1b;
      iVar1 = memcmp(in_RDI[1]._options.routing_id + 0x6b,"PLAIN",0x14);
      in_EDX = extraout_EDX_00;
      if (iVar1 == 0) {
        if ((in_RDI->_options).as_server == 0) {
          this_00 = (plain_client_t *)operator_new(0x5a0,(nothrow_t *)&std::nothrow);
          ppVar4 = (plain_client_t *)0x0;
          if (this_00 != (plain_client_t *)0x0) {
            psVar3 = stream_engine_base_t::session(in_RDI);
            plain_client_t::plain_client_t(this_00,psVar3,in_stack_ffffffffffffff30);
            ppVar4 = this_00;
          }
          in_RDI->_mechanism = (mechanism_t *)ppVar4;
        }
        else {
          pvVar2 = operator_new(0x5e8,(nothrow_t *)&std::nothrow);
          local_90 = (void *)0x0;
          if (pvVar2 != (void *)0x0) {
            psVar3 = stream_engine_base_t::session(in_RDI);
            plain_server_t::plain_server_t
                      ((plain_server_t *)psVar3,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (options_t *)in_stack_ffffffffffffff48);
            local_90 = pvVar2;
          }
          pmVar5 = (mechanism_t *)0x0;
          if (local_90 != (void *)0x0) {
            pmVar5 = (mechanism_t *)((long)local_90 + 0x50);
          }
          in_RDI->_mechanism = pmVar5;
        }
        if (in_RDI->_mechanism == (mechanism_t *)0x0) {
          fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
                  ,0x16c);
          fflush(_stderr);
          zmq_abort((char *)0x312767);
        }
        goto LAB_003127b6;
      }
    }
    stream_engine_base_t::socket(in_RDI,in_ESI,in_EDX,in_ECX);
    iVar1 = extraout_var;
    stream_engine_base_t::session(in_RDI);
    session_base_t::get_endpoint((session_base_t *)0x31278c);
    socket_base_t::event_handshake_failed_protocol
              (in_stack_ffffffffffffff40,(endpoint_uri_pair_t *)in_stack_ffffffffffffff38,iVar1);
    stream_engine_base_t::error(in_stack_ffffffffffffff90,reason_);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v3_x (const bool downgrade_sub_)
{
    if (_options.mechanism == ZMQ_NULL
        && memcmp (_greeting_recv + 12, "NULL\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0",
                   20)
             == 0) {
        _mechanism = new (std::nothrow)
          null_mechanism_t (session (), _peer_address, _options);
        alloc_assert (_mechanism);
    } else if (_options.mechanism == ZMQ_PLAIN
               && memcmp (_greeting_recv + 12,
                          "PLAIN\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                    == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow)
              plain_server_t (session (), _peer_address, _options);
        else
            _mechanism =
              new (std::nothrow) plain_client_t (session (), _options);
        alloc_assert (_mechanism);
    }
#ifdef ZMQ_HAVE_CURVE
    else if (_options.mechanism == ZMQ_CURVE
             && memcmp (_greeting_recv + 12,
                        "CURVE\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                  == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow) curve_server_t (
              session (), _peer_address, _options, downgrade_sub_);
        else
            _mechanism = new (std::nothrow)
              curve_client_t (session (), _options, downgrade_sub_);
        alloc_assert (_mechanism);
    }
#endif
#ifdef HAVE_LIBGSSAPI_KRB5
    else if (_options.mechanism == ZMQ_GSSAPI
             && memcmp (_greeting_recv + 12,
                        "GSSAPI\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                  == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow)
              gssapi_server_t (session (), _peer_address, _options);
        else
            _mechanism =
              new (std::nothrow) gssapi_client_t (session (), _options);
        alloc_assert (_mechanism);
    }
#endif
    else {
        socket ()->event_handshake_failed_protocol (
          session ()->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MECHANISM_MISMATCH);
        error (protocol_error);
        return false;
    }